

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O0

RC __thiscall PF_BufferMgr::InitPageDesc(PF_BufferMgr *this,int fd,PageNum pageNum,int slot)

{
  int slot_local;
  PageNum pageNum_local;
  int fd_local;
  PF_BufferMgr *this_local;
  
  this->bufTable[slot].fd = fd;
  this->bufTable[slot].pageNum = pageNum;
  this->bufTable[slot].bDirty = 0;
  this->bufTable[slot].pinCount = 1;
  return 0;
}

Assistant:

RC PF_BufferMgr::InitPageDesc(int fd, PageNum pageNum, int slot)
{
   // set the slot to refer to a newly-pinned page
   bufTable[slot].fd       = fd;
   bufTable[slot].pageNum  = pageNum;
   bufTable[slot].bDirty   = FALSE;
   bufTable[slot].pinCount = 1;

   // Return ok
   return (0);
}